

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O2

void __thiscall ipx::IPM::AddCorrector(IPM *this,Step *step)

{
  uint uVar1;
  Iterate *this_00;
  Iterate *pIVar2;
  double *pdVar3;
  double *pdVar4;
  double *rl;
  Vector *pVVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double alpha;
  double alpha_00;
  double dVar13;
  Vector su;
  Vector sl;
  
  this_00 = this->iterate_;
  uVar10 = (long)this_00->model_->num_cols_ + (long)this_00->model_->num_rows_;
  dVar11 = Iterate::mu(this_00);
  lVar6 = 0;
  dVar12 = StepToBoundary(&this_00->xl_,&step->xl,(Int *)0x0,dVar11);
  alpha = StepToBoundary(&this_00->xu_,&step->xu,(Int *)0x0,dVar12);
  alpha_00 = StepToBoundary(&this_00->zl_,&step->zl,(Int *)0x0,alpha);
  dVar13 = StepToBoundary(&this_00->zu_,&step->zu,(Int *)0x0,alpha_00);
  if (dVar12 <= alpha) {
    alpha = dVar12;
  }
  if (alpha_00 <= dVar13) {
    dVar13 = alpha_00;
  }
  uVar9 = 0;
  if (0 < (int)uVar10) {
    uVar9 = uVar10 & 0xffffffff;
  }
  dVar12 = 0.0;
  iVar8 = 0;
  for (; uVar9 * 4 - lVar6 != 0; lVar6 = lVar6 + 4) {
    uVar1 = *(uint *)((long)(this->iterate_->variable_state_).
                            super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar6);
    if ((uVar1 & 0xfffffffd) == 0) {
      dVar12 = dVar12 + (*(double *)((long)(step->zl)._M_data + lVar6 * 2) * dVar13 +
                        *(double *)((long)(this_00->zl_)._M_data + lVar6 * 2)) *
                        (*(double *)((long)(step->xl)._M_data + lVar6 * 2) * alpha +
                        *(double *)((long)(this_00->xl_)._M_data + lVar6 * 2));
      iVar8 = iVar8 + 1;
    }
    if (uVar1 - 1 < 2) {
      dVar12 = dVar12 + (*(double *)((long)(step->zu)._M_data + lVar6 * 2) * dVar13 +
                        *(double *)((long)(this_00->zu_)._M_data + lVar6 * 2)) *
                        (*(double *)((long)(step->xu)._M_data + lVar6 * 2) * alpha +
                        *(double *)((long)(this_00->xu_)._M_data + lVar6 * 2));
      iVar8 = iVar8 + 1;
    }
  }
  dVar13 = (dVar12 / (double)iVar8) / dVar11;
  std::valarray<double>::valarray(&sl,uVar10);
  pIVar2 = this->iterate_;
  dVar11 = dVar13 * dVar13 * dVar13 * dVar11;
  pdVar3 = (step->xl)._M_data;
  pdVar4 = (step->zl)._M_data;
  for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    dVar13 = 0.0;
    if (((pIVar2->variable_state_).
         super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>.
         _M_impl.super__Vector_impl_data._M_start[uVar7] & ~BARRIER_BOXED) == BARRIER_LB) {
      dVar13 = (dVar11 - (this_00->xl_)._M_data[uVar7] * (this_00->zl_)._M_data[uVar7]) -
               pdVar3[uVar7] * pdVar4[uVar7];
    }
    sl._M_data[uVar7] = dVar13;
  }
  std::valarray<double>::valarray(&su,uVar10);
  pIVar2 = this->iterate_;
  pdVar3 = (step->xu)._M_data;
  pdVar4 = (step->zu)._M_data;
  for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    dVar13 = 0.0;
    if ((pIVar2->variable_state_).
        super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar10] - BARRIER_UB < 2) {
      dVar13 = (dVar11 - (this_00->xu_)._M_data[uVar10] * (this_00->zu_)._M_data[uVar10]) -
               pdVar3[uVar10] * pdVar4[uVar10];
    }
    su._M_data[uVar10] = dVar13;
  }
  pVVar5 = Iterate::rb(this->iterate_);
  pdVar3 = pVVar5->_M_data;
  pVVar5 = Iterate::rc(this->iterate_);
  pdVar4 = pVVar5->_M_data;
  pVVar5 = Iterate::rl(this->iterate_);
  rl = pVVar5->_M_data;
  pVVar5 = Iterate::ru(this->iterate_);
  SolveNewtonSystem(this,pdVar3,pdVar4,rl,pVVar5->_M_data,sl._M_data,su._M_data,step);
  operator_delete(su._M_data);
  operator_delete(sl._M_data);
  return;
}

Assistant:

void IPM::AddCorrector(Step& step) {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& xl = iterate_->xl();
    const Vector& xu = iterate_->xu();
    const Vector& zl = iterate_->zl();
    const Vector& zu = iterate_->zu();
    const Vector& dxl = step.xl;
    const Vector& dxu = step.xu;
    const Vector& dzl = step.zl;
    const Vector& dzu = step.zu;
    const double mu = iterate_->mu();

    // Choose centering parameter.
    double step_xl = StepToBoundary(xl, dxl, nullptr);
    double step_xu = StepToBoundary(xu, dxu, nullptr);
    double step_zl = StepToBoundary(zl, dzl, nullptr);
    double step_zu = StepToBoundary(zu, dzu, nullptr);
    double maxp = std::min(step_xl, step_xu);
    double maxd = std::min(step_zl, step_zu);
    double muaff = 0.0;
    Int num_finite = 0;
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->has_barrier_lb(j)) {
            assert(std::isfinite(xl[j]));
            assert(xl[j] != 0.0);
            muaff += (xl[j]+maxp*dxl[j]) * (zl[j]+maxd*dzl[j]);
            num_finite++;
        }
        if (iterate_->has_barrier_ub(j)) {
            assert(std::isfinite(xu[j]));
            assert(xu[j] != 0.0);
            muaff += (xu[j]+maxp*dxu[j]) * (zu[j]+maxd*dzu[j]);
            num_finite++;
        }
    }
    assert(std::isfinite(muaff));
    muaff /= num_finite;
    double ratio = muaff / mu;
    double sigma = ratio * ratio * ratio;

    // sl = -xl.*zl + sigma*mu - dxl.*dzl
    Vector sl(n+m);
    for (Int j = 0; j < n+m; j++)
        if (iterate_->has_barrier_lb(j))
            sl[j] = -xl[j]*zl[j] + sigma*mu - dxl[j]*dzl[j];
        else
            sl[j] = 0.0;
    assert(AllFinite(sl));

    // su = -xu.*zu + sigma*mu - dxu.*dzu
    Vector su(n+m);
    for (Int j = 0; j < n+m; j++)
        if (iterate_->has_barrier_ub(j))
            su[j] = -xu[j]*zu[j] + sigma*mu - dxu[j]*dzu[j];
        else
            su[j] = 0.0;
    assert(AllFinite(su));

    SolveNewtonSystem(&iterate_->rb()[0], &iterate_->rc()[0],
                      &iterate_->rl()[0], &iterate_->ru()[0], &sl[0], &su[0],
                      step);
}